

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffdrow(fitsfile *fptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  FITSfile *pFVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *err_message;
  long lVar7;
  undefined1 auVar8 [16];
  LONGLONG naxis1;
  int tstatus;
  char comm [73];
  long local_98;
  int local_8c;
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_00113b82;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (fptr->Fptr->hdutype == 0) {
    ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrow)");
    *status = 0xeb;
    return 0xeb;
  }
  if (nrows < 0) {
    *status = 0x132;
    return 0x132;
  }
  if (nrows == 0) {
LAB_00113b82:
    return *status;
  }
  ffgkyjj(fptr,"NAXIS1",&local_98,local_88,status);
  pFVar1 = fptr->Fptr;
  lVar2 = pFVar1->numrows;
  if (lVar2 < firstrow) {
    err_message = "Delete position greater than the number of rows in the table (ffdrow)";
  }
  else if (firstrow < 1) {
    err_message = "Delete position is less than 1 (ffdrow)";
  }
  else {
    lVar6 = nrows + firstrow + -1;
    if (lVar6 <= lVar2) {
      lVar6 = lVar6 * local_98;
      lVar5 = local_98 * nrows;
      lVar7 = pFVar1->heapsize + pFVar1->heapstart;
      ffshft(fptr,lVar6 + pFVar1->datastart,lVar7 - lVar6,-lVar5,status);
      lVar7 = lVar7 + 0xb3f;
      uVar4 = lVar5 + 0xb3f + ((lVar7 / 0xb40) * 0xb40 - lVar7);
      if (0xb3f < (long)uVar4) {
        ffdblk(fptr,uVar4 / 0xb40,status);
      }
      lVar5 = fptr->Fptr->heapstart - lVar5;
      fptr->Fptr->heapstart = lVar5;
      local_8c = 0;
      ffmkyj(fptr,"THEAP",lVar5,"&",&local_8c);
      ffmkyj(fptr,"NAXIS2",lVar2 - nrows,"&",status);
      pFVar1 = fptr->Fptr;
      auVar8._8_4_ = (int)nrows;
      auVar8._0_8_ = nrows;
      auVar8._12_4_ = (int)((ulong)nrows >> 0x20);
      pFVar1->origrows = pFVar1->origrows - nrows;
      pFVar1->numrows = pFVar1->numrows - auVar8._8_8_;
      ffcmph(fptr,status);
      goto LAB_00113b82;
    }
    err_message = "No. of rows to delete exceeds size of table (ffdrow)";
  }
  ffpmsg(err_message);
  *status = 0x133;
  return 0x133;
}

Assistant:

int ffdrow(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG firstrow,   /* I - first row to delete (1 = first)          */
           LONGLONG nrows,      /* I - number of rows to delete                 */
           int *status)     /* IO - error status                            */
/*
 delete NROWS rows from table starting with firstrow (1 = first row of table).
*/
{
    int tstatus;
    LONGLONG naxis1, naxis2;
    LONGLONG datasize, firstbyte, nbytes, nshift;
    LONGLONG freespace;
    long nblock;
    char comm[FLEN_COMMENT];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrow)");
        return(*status = NOT_TABLE);
    }

    if (nrows < 0 )
        return(*status = NEG_BYTES);
    else if (nrows == 0)
        return(*status);   /* no op, so just return */

    ffgkyjj(fptr, "NAXIS1", &naxis1, comm, status); /* get the current   */

   /* ffgkyj(fptr, "NAXIS2", &naxis2, comm, status);*/ /* size of the table */

    /* the NAXIS2 keyword may not be up to date, so use the structure value */
    naxis2 = (fptr->Fptr)->numrows;

    if (firstrow > naxis2)
    {
        ffpmsg(
   "Delete position greater than the number of rows in the table (ffdrow)");
        return(*status = BAD_ROW_NUM);
    }
    else if (firstrow < 1)
    {
        ffpmsg("Delete position is less than 1 (ffdrow)");
        return(*status = BAD_ROW_NUM);
    }
    else if (firstrow + nrows - 1 > naxis2)
    {
        ffpmsg("No. of rows to delete exceeds size of table (ffdrow)");
        return(*status = BAD_ROW_NUM);
    }

    nshift = naxis1 * nrows;   /* no. of bytes to delete from table */
    /* cur size of data */
    datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;

    firstbyte = naxis1 * (firstrow + nrows - 1); /* relative del pos */
    nbytes = datasize - firstbyte;    /* no. of bytes to shift up */
    firstbyte += ((fptr->Fptr)->datastart);   /* absolute delete position */

    ffshft(fptr, firstbyte, nbytes,  nshift * (-1), status); /* shift data */

    freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;
    nblock = (long) ((nshift + freespace) / 2880);   /* number of blocks */

    /* delete integral number blocks */
    if (nblock > 0) 
        ffdblk(fptr, nblock, status);

    /* update the heap starting address */
    (fptr->Fptr)->heapstart -= nshift;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (long)(fptr->Fptr)->heapstart, "&", &tstatus);

    /* update the NAXIS2 keyword */
    ffmkyj(fptr, "NAXIS2", naxis2 - nrows, "&", status);
    ((fptr->Fptr)->numrows) -= nrows;
    ((fptr->Fptr)->origrows) -= nrows;

    /* Update the heap data, if any.  This will remove any orphaned data */
    /* that was only pointed to by the rows that have been deleted */
    ffcmph(fptr, status);
    return(*status);
}